

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::C_SignFinal
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pSignature,
          CK_ULONG_PTR pulSignatureLen)

{
  bool bVar1;
  int iVar2;
  Session *this_00;
  MacAlgorithm *pMVar3;
  ulong __n;
  size_t sVar4;
  uchar *__src;
  CK_RV CVar5;
  ByteString local_58;
  undefined4 extraout_var;
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (pulSignatureLen == (CK_ULONG_PTR)0x0) {
    return 7;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  iVar2 = Session::getOpType(this_00);
  if (iVar2 != 5) {
    return 0x91;
  }
  bVar1 = Session::getAllowMultiPartOp(this_00);
  if (!bVar1) {
    return 0x91;
  }
  pMVar3 = Session::getMacOp(this_00);
  if (pMVar3 == (MacAlgorithm *)0x0) {
    CVar5 = AsymSignFinal(this_00,pSignature,pulSignatureLen);
    return CVar5;
  }
  pMVar3 = Session::getMacOp(this_00);
  if (pMVar3 == (MacAlgorithm *)0x0) {
    Session::resetOp(this_00);
    return 0x91;
  }
  iVar2 = (*pMVar3->_vptr_MacAlgorithm[0xb])(pMVar3);
  __n = CONCAT44(extraout_var,iVar2);
  if (pSignature == (CK_BYTE_PTR)0x0) {
    *pulSignatureLen = __n;
    return 0;
  }
  if (*pulSignatureLen < __n) {
    *pulSignatureLen = __n;
    return 0x150;
  }
  ByteString::ByteString(&local_58);
  iVar2 = (*pMVar3->_vptr_MacAlgorithm[4])(pMVar3,&local_58);
  if ((char)iVar2 != '\0') {
    sVar4 = ByteString::size(&local_58);
    if (sVar4 == __n) {
      __src = ByteString::byte_str(&local_58);
      memcpy(pSignature,__src,__n);
      *pulSignatureLen = __n;
      Session::resetOp(this_00);
      CVar5 = 0;
      goto LAB_00135b9a;
    }
    softHSMLog(3,"MacSignFinal",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x12bb,"The size of the signature differs from the size of the mechanism");
  }
  CVar5 = 5;
  Session::resetOp(this_00);
LAB_00135b9a:
  local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_58.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return CVar5;
}

Assistant:

CK_RV SoftHSM::C_SignFinal(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pSignature, CK_ULONG_PTR pulSignatureLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pulSignatureLen == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_SIGN || !session->getAllowMultiPartOp())
		return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getMacOp() != NULL)
		return MacSignFinal(session, pSignature, pulSignatureLen);
	else
		return AsymSignFinal(session, pSignature, pulSignatureLen);
}